

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

int booster::locale::gnu_gettext::message_key<char>::compare(char_type *l,char_type *r)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    bVar1 = l[lVar3];
    bVar2 = r[lVar3];
    if (bVar1 == 0 && bVar2 == 0) {
      return 0;
    }
    if (bVar1 < bVar2) break;
    lVar3 = lVar3 + 1;
    if (bVar2 < bVar1) {
      return 1;
    }
  }
  return -1;
}

Assistant:

static int compare(char_type const *l,char_type const *r)
                {
                    typedef std::char_traits<char_type> traits_type;
                    for(;;) {
                        char_type cl = *l++;
                        char_type cr = *r++;
                        if(cl == 0 && cr == 0)
                            return 0;
                        if(traits_type::lt(cl,cr))
                            return -1;
                        if(traits_type::lt(cr,cl))
                            return 1;
                    }
                }